

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_sequence<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  SequenceBegin sb;
  RepeatBegin RVar1;
  RepeatEnd re;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  string_view tag_00;
  uint32_t size;
  uint local_8c;
  uint local_88;
  undefined4 uStack_84;
  string_view sStack_80;
  uint local_70;
  undefined4 uStack_6c;
  string_view sStack_68;
  ulong local_58;
  string_view sStack_50;
  string_view local_40;
  
  uVar4 = (ulong)(tag._len != 0);
  local_40._ptr = tag._ptr + uVar4;
  local_40._len = tag._len - uVar4;
  TrivialDeserializer<unsigned_int>::deserialize<binlog::Range>(&local_8c,istream);
  tag_00 = tag_pop(&local_40);
  sVar5 = tag_00._len;
  local_58 = (ulong)local_8c;
  sStack_50._ptr = tag_00._ptr;
  pcVar2 = sStack_50._ptr;
  sb.tag._ptr = sStack_50._ptr;
  sb.size = (ulong)local_8c;
  sb.tag._len = sVar5;
  sStack_50 = tag_00;
  bVar3 = binlog::ToStringVisitor::visit(visitor,sb,istream);
  if (!bVar3) {
    if ((local_8c < 0x21) || (bVar3 = singular_impl(full_tag,tag_00,max_recursion), !bVar3)) {
      while (bVar3 = local_8c != 0, local_8c = local_8c - 1, bVar3) {
        visit_impl<binlog::ToStringVisitor,binlog::Range>
                  (full_tag,tag_00,visitor,istream,max_recursion);
      }
    }
    else {
      local_70 = local_8c;
      RVar1._4_4_ = uStack_6c;
      RVar1.size = local_8c;
      RVar1.tag._ptr = pcVar2;
      RVar1.tag._len = sVar5;
      sStack_68 = tag_00;
      binlog::ToStringVisitor::visit(visitor,RVar1);
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag,tag_00,visitor,istream,max_recursion);
      local_88 = local_8c;
      re._4_4_ = uStack_84;
      re.size = local_8c;
      re.tag._ptr = pcVar2;
      re.tag._len = sVar5;
      sStack_80 = tag_00;
      binlog::ToStringVisitor::visit(visitor,re);
    }
    binlog::ToStringVisitor::visit(visitor);
    return;
  }
  return;
}

Assistant:

void visit_sequence(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop [

  std::uint32_t size;
  mserialize::deserialize(size, istream);
  const string_view elem_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::SequenceBegin{size, elem_tag}, istream);
  if (skip) { return; }

  if (size > 32 && singular(full_tag, elem_tag, max_recursion))
  {
    // every elem in the seq are the same and serialized using 0 bytes.
    // visit the first one only, to prevent little input generating huge output
    visitor.visit(mserialize::Visitor::RepeatBegin{size, elem_tag});
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    visitor.visit(mserialize::Visitor::RepeatEnd{size, elem_tag});
  }
  else
  {
    while (size--)
    {
      visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    }
  }

  visitor.visit(mserialize::Visitor::SequenceEnd{});
}